

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

Node * mainposition(Table *t,TValue *key)

{
  ushort uVar1;
  Node *pNVar2;
  uint uVar3;
  ushort uVar4;
  char *__function;
  char *__assertion;
  ulong uVar5;
  double dVar6;
  int local_1c;
  
  uVar1 = key->tt_;
  uVar4 = uVar1 & 0x7f;
  switch(uVar4) {
  case 1:
    if (uVar1 != 1) {
      __assertion = "((((key))->tt_) == (1))";
      __function = "Node *mainposition(const Table *, const TValue *)";
      uVar3 = 0x70;
      goto LAB_00120403;
    }
    uVar5 = (ulong)(t->hmask & (key->value_).b);
    goto LAB_001202de;
  case 2:
    if (uVar1 != 2) {
      __assertion = "((((key))->tt_) == (2))";
      __function = "Node *mainposition(const Table *, const TValue *)";
      uVar3 = 0x72;
      goto LAB_00120403;
    }
    break;
  case 3:
    if (uVar1 == 3) {
      pNVar2 = t->node;
      dVar6 = frexp((key->value_).n,&local_1c);
      dVar6 = dVar6 * 2147483648.0;
      if ((dVar6 < -9.223372036854776e+18) || (9.223372036854776e+18 <= dVar6)) {
        uVar3 = 0;
        if ((long)ABS(dVar6) < 0x7ff0000000000000) {
          __assertion = "(!(((n))==((n)))) || fabs(n) == ((lua_Number)(((__builtin_huge_val ()))))";
          __function = "int l_hashfloat(lua_Number)";
          uVar3 = 0x56;
          goto LAB_00120403;
        }
      }
      else {
        uVar3 = (int)(long)dVar6 + local_1c;
        uVar3 = (int)uVar3 >> 0x1f ^ uVar3;
      }
      return pNVar2 + (ulong)uVar3 % (ulong)(t->hmask | 1);
    }
    __assertion = "((((key))->tt_) == (((3) | ((0) << 4))))";
    __function = "Node *mainposition(const Table *, const TValue *)";
    uVar3 = 0x6a;
    goto LAB_00120403;
  case 4:
    if ((uVar1 & 0xf) == 4) {
      if ((((key->value_).gc)->tt & 0xf) == 4) {
        uVar5 = (ulong)(t->hmask & *(uint *)&((key->value_).gc)->field_0xc);
        goto LAB_001202de;
      }
      __assertion = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
    }
    else {
      __assertion = "(((((((key))->tt_)) & 0x0F)) == (4))";
    }
    __function = "Node *mainposition(const Table *, const TValue *)";
    uVar3 = 0x6c;
LAB_00120403:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                  ,uVar3,__function);
  default:
    if (uVar4 != 0x46) {
      if (uVar4 == 0x14) {
        if ((uVar1 & 0xf) == 4) {
          if ((((TString *)(key->value_).gc)->tt & 0xf) == 4) {
            pNVar2 = t->node;
            uVar3 = luaS_hashlongstr((TString *)(key->value_).gc);
            return pNVar2 + (uVar3 & t->hmask);
          }
          __assertion = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
        }
        else {
          __assertion = "(((((((key))->tt_)) & 0x0F)) == (4))";
        }
        __function = "Node *mainposition(const Table *, const TValue *)";
        uVar3 = 0x6e;
        goto LAB_00120403;
      }
      if (uVar4 == 0x16) {
        if (uVar1 != 0x16) {
          __assertion = "((((key))->tt_) == (((6) | ((1) << 4))))";
          __function = "Node *mainposition(const Table *, const TValue *)";
          uVar3 = 0x74;
          goto LAB_00120403;
        }
      }
      else {
        if (uVar4 == 0x13) {
          if (uVar1 == 0x13) {
            uVar5 = (ulong)((key->value_).b & t->hmask);
            goto LAB_001202de;
          }
          __assertion = "((((key))->tt_) == (((3) | ((1) << 4))))";
          __function = "Node *mainposition(const Table *, const TValue *)";
          uVar3 = 0x68;
          goto LAB_00120403;
        }
        if (uVar1 == 10) {
          __assertion = "!((((key))->tt_) == ((9+1)))";
          __function = "Node *mainposition(const Table *, const TValue *)";
          uVar3 = 0x78;
          goto LAB_00120403;
        }
        if (-1 < (short)uVar1) {
          __assertion = "(((key)->tt_) & (1 << 15))";
          __function = "Node *mainposition(const Table *, const TValue *)";
          uVar3 = 0x79;
          goto LAB_00120403;
        }
      }
    }
  }
  uVar5 = (ulong)(uint)(key->value_).b % (ulong)(t->hmask | 1);
LAB_001202de:
  return t->node + uVar5;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMINT:
      return hashint(t, ivalue(key));
    case LUA_TNUMFLT:
      return hashmod(t, l_hashfloat(fltvalue(key)));
    case LUA_TSHRSTR:
      return hashstr(t, tsvalue(key));
    case LUA_TLNGSTR:
      return hashpow2(t, luaS_hashlongstr(tsvalue(key)));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    case RAVI_TFCF:
      return hashpointer(t, fcfvalue(key));
    default:
      lua_assert(!ttisdeadkey(key));
      return hashpointer(t, gcvalue(key));
  }
}